

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall
FfsParser::parseVendorHashFile(FfsParser *this,UByteArray *fileGuid,UModelIndex *index)

{
  TreeModel *pTVar1;
  UByteArray *index_00;
  bool bVar2;
  UINT32 UVar3;
  CBString local_5c0;
  CBString local_5a8;
  UByteArray local_590;
  undefined1 local_570 [8];
  PROTECTED_RANGE range_7;
  undefined1 local_520 [8];
  PROTECTED_RANGE range_6;
  undefined1 local_4d0 [8];
  PROTECTED_RANGE range_5;
  undefined1 local_480 [8];
  PROTECTED_RANGE range_4;
  byte local_431;
  undefined1 local_430 [7];
  UINT8 j_3;
  CBString local_418;
  CBString local_400;
  CBString local_3e8;
  CBString local_3d0;
  CBString local_3b8;
  char *local_3a0;
  PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V3 *entry_4;
  UByteArray local_380;
  undefined1 local_360 [8];
  PROTECTED_RANGE range_3;
  undefined1 local_310 [8];
  PROTECTED_RANGE range_2;
  byte local_2c1;
  undefined1 local_2c0 [7];
  UINT8 j_2;
  CBString local_2a8;
  byte local_289;
  undefined1 local_288 [7];
  UINT8 j_1;
  CBString local_270;
  char *local_258;
  PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V2 *entry_3;
  UByteArray local_238;
  undefined1 local_218 [8];
  PROTECTED_RANGE range_1;
  byte local_1c9;
  undefined1 local_1c8 [7];
  UINT8 i_2;
  char *local_1b0;
  PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V1 *entry_2;
  undefined1 local_190 [8];
  UModelIndex fileIndex;
  CBString local_160;
  byte local_141;
  undefined1 local_140 [7];
  UINT8 j;
  long local_128;
  PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY *entry_1;
  undefined1 local_118 [4];
  UINT32 i_1;
  UByteArray local_100;
  undefined1 local_e0 [8];
  PROTECTED_RANGE range;
  PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY *entry;
  UINT32 i;
  bool protectedRangesFound;
  long *local_88;
  PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_PHOENIX *header;
  uint local_54;
  undefined1 local_50 [4];
  UINT32 size;
  UByteArray *local_30;
  UByteArray *body;
  UModelIndex *index_local;
  UByteArray *fileGuid_local;
  FfsParser *this_local;
  
  body = (UByteArray *)index;
  index_local = (UModelIndex *)fileGuid;
  fileGuid_local = (UByteArray *)this;
  bVar2 = UModelIndex::isValid(index);
  if (bVar2) {
    TreeModel::body((UByteArray *)local_50,this->model,(UModelIndex *)body);
    local_30 = (UByteArray *)local_50;
    local_54 = UByteArray::size((UByteArray *)local_50);
    bVar2 = UByteArray::operator==
                      ((UByteArray *)index_local,&PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_PHOENIX);
    if (bVar2) {
      if (local_54 < 0xc) {
        usprintf((CBString *)&header,"%s: unknown or corrupted Phoenix protected ranges hash file",
                 "parseVendorHashFile");
        msg(this,(CBString *)&header,(UModelIndex *)body);
        Bstrlib::CBString::~CBString((CBString *)&header);
      }
      else {
        local_88 = (long *)UByteArray::constData(local_30);
        if (*local_88 == 0x4c42544853414824) {
          if ((ulong)local_54 < (ulong)*(uint *)(local_88 + 1) * 0x28 + 0xc) {
            usprintf((CBString *)&i,"%s: unknown or corrupted Phoenix protected ranges hash file",
                     "parseVendorHashFile");
            msg(this,(CBString *)&i,(UModelIndex *)body);
            Bstrlib::CBString::~CBString((CBString *)&i);
          }
          else if ((int)local_88[1] != 0) {
            bVar2 = false;
            for (entry._0_4_ = 0; (uint)entry < *(uint *)(local_88 + 1);
                entry._0_4_ = (uint)entry + 1) {
              range.Hash.d.field_2._8_8_ = (long)local_88 + (ulong)(uint)entry * 0x28 + 0xc;
              if (((*(int *)(range.Hash.d.field_2._8_8_ + 0x20) != -1) &&
                  (*(int *)(range.Hash.d.field_2._8_8_ + 0x24) != 0)) &&
                 (*(int *)(range.Hash.d.field_2._8_8_ + 0x24) != -1)) {
                bVar2 = true;
                local_e0._0_4_ = 0;
                local_e0._4_4_ = 0;
                range.Offset._0_2_ = 0;
                range.Offset._2_1_ = 0;
                UByteArray::UByteArray((UByteArray *)&range.AlgorithmId);
                local_e0._0_4_ = *(UINT32 *)(range.Hash.d.field_2._8_8_ + 0x20);
                local_e0._4_4_ = *(UINT32 *)(range.Hash.d.field_2._8_8_ + 0x24);
                range.Offset._0_2_ = 0xb;
                UByteArray::UByteArray(&local_100,(char *)range.Hash.d.field_2._8_8_,0x20);
                UByteArray::operator=((UByteArray *)&range.AlgorithmId,&local_100);
                UByteArray::~UByteArray(&local_100);
                range.Offset._2_1_ = 4;
                std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                          (&this->protectedRanges,(value_type *)local_e0);
                PROTECTED_RANGE_::~PROTECTED_RANGE_((PROTECTED_RANGE_ *)local_e0);
              }
            }
            if (bVar2) {
              UVar3 = TreeModel::base(this->model,(UModelIndex *)body);
              usprintf((CBString *)local_118,
                       "Phoenix hash file found at base %08Xh\nProtected ranges:\n",(ulong)UVar3);
              Bstrlib::CBString::operator+=(&this->securityInfo,(CBString *)local_118);
              Bstrlib::CBString::~CBString((CBString *)local_118);
              for (entry_1._4_4_ = 0; entry_1._4_4_ < *(uint *)(local_88 + 1);
                  entry_1._4_4_ = entry_1._4_4_ + 1) {
                local_128 = (long)local_88 + (ulong)entry_1._4_4_ * 0x28 + 0xc;
                usprintf((CBString *)local_140,"RelativeOffset: %08Xh Size: %Xh\nHash: ",
                         (ulong)*(uint *)(local_128 + 0x20),(ulong)*(uint *)(local_128 + 0x24));
                Bstrlib::CBString::operator+=(&this->securityInfo,(CBString *)local_140);
                Bstrlib::CBString::~CBString((CBString *)local_140);
                for (local_141 = 0; local_141 < 0x20; local_141 = local_141 + 1) {
                  usprintf(&local_160,"%02X",(ulong)*(byte *)(local_128 + (ulong)local_141));
                  Bstrlib::CBString::operator+=(&this->securityInfo,&local_160);
                  Bstrlib::CBString::~CBString(&local_160);
                }
                Bstrlib::CBString::operator+=(&this->securityInfo,"\n");
              }
            }
          }
        }
      }
      index_00 = body;
      pTVar1 = this->model;
      Bstrlib::CBString::CBString((CBString *)&fileIndex.m,"Phoenix protected ranges hash file");
      TreeModel::setText(pTVar1,(UModelIndex *)index_00,(CBString *)&fileIndex.m);
      Bstrlib::CBString::~CBString((CBString *)&fileIndex.m);
    }
    else {
      bVar2 = UByteArray::operator==
                        ((UByteArray *)index_local,&PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_AMI);
      if (bVar2) {
        TreeModel::parent((UModelIndex *)local_190,this->model,(UModelIndex *)body);
        if (local_54 == 0x24) {
          UVar3 = TreeModel::base(this->model,(UModelIndex *)local_190);
          usprintf((CBString *)&entry_2,
                   "AMI protected ranges hash file v1 found at base %08Xh\nProtected range:\n",
                   (ulong)UVar3);
          Bstrlib::CBString::operator+=(&this->securityInfo,(CBString *)&entry_2);
          Bstrlib::CBString::~CBString((CBString *)&entry_2);
          local_1b0 = UByteArray::constData(local_30);
          usprintf((CBString *)local_1c8,"Size: %Xh\nHash (SHA256): ",
                   (ulong)*(uint *)(local_1b0 + 0x20));
          Bstrlib::CBString::operator+=(&this->securityInfo,(CBString *)local_1c8);
          Bstrlib::CBString::~CBString((CBString *)local_1c8);
          for (local_1c9 = 0; local_1c9 < 0x20; local_1c9 = local_1c9 + 1) {
            usprintf((CBString *)((long)&range_1.Hash.d.field_2 + 8),"%02X",
                     (ulong)(byte)local_1b0[local_1c9]);
            Bstrlib::CBString::operator+=
                      (&this->securityInfo,(CBString *)((long)&range_1.Hash.d.field_2 + 8));
            Bstrlib::CBString::~CBString((CBString *)((long)&range_1.Hash.d.field_2 + 8));
          }
          Bstrlib::CBString::operator+=(&this->securityInfo,"\n");
          if ((*(int *)(local_1b0 + 0x20) != 0) && (*(int *)(local_1b0 + 0x20) != -1)) {
            local_218._0_4_ = 0;
            local_218._4_4_ = 0;
            range_1.Offset._0_2_ = 0;
            range_1.Offset._2_1_ = 0;
            UByteArray::UByteArray((UByteArray *)&range_1.AlgorithmId);
            local_218._0_4_ = 0;
            local_218._4_4_ = *(undefined4 *)(local_1b0 + 0x20);
            range_1.Offset._0_2_ = 0xb;
            UByteArray::UByteArray(&local_238,local_1b0,0x20);
            UByteArray::operator=((UByteArray *)&range_1.AlgorithmId,&local_238);
            UByteArray::~UByteArray(&local_238);
            range_1.Offset._2_1_ = 5;
            std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                      (&this->protectedRanges,(value_type *)local_218);
            PROTECTED_RANGE_::~PROTECTED_RANGE_((PROTECTED_RANGE_ *)local_218);
          }
          pTVar1 = this->model;
          Bstrlib::CBString::CBString((CBString *)&entry_3,"AMI v1 protected ranges hash file");
          TreeModel::setText(pTVar1,(UModelIndex *)local_190,(CBString *)&entry_3);
          Bstrlib::CBString::~CBString((CBString *)&entry_3);
        }
        else if (local_54 == 0x50) {
          local_258 = UByteArray::constData(local_30);
          UVar3 = TreeModel::base(this->model,(UModelIndex *)local_190);
          usprintf(&local_270,
                   "AMI v2 protected ranges hash file found at base %08Xh\nProtected ranges:",
                   (ulong)UVar3);
          Bstrlib::CBString::operator+=(&this->securityInfo,&local_270);
          Bstrlib::CBString::~CBString(&local_270);
          usprintf((CBString *)local_288,"\nAddress: %08Xh, Size: %Xh\nHash (SHA256): ",
                   (ulong)*(uint *)(local_258 + 0x20),(ulong)*(uint *)(local_258 + 0x24));
          Bstrlib::CBString::operator+=(&this->securityInfo,(CBString *)local_288);
          Bstrlib::CBString::~CBString((CBString *)local_288);
          for (local_289 = 0; local_289 < 0x20; local_289 = local_289 + 1) {
            usprintf(&local_2a8,"%02X",(ulong)(byte)local_258[local_289]);
            Bstrlib::CBString::operator+=(&this->securityInfo,&local_2a8);
            Bstrlib::CBString::~CBString(&local_2a8);
          }
          usprintf((CBString *)local_2c0,"\nAddress: %08Xh, Size: %Xh\nHash (SHA256): ",
                   (ulong)*(uint *)(local_258 + 0x48),(ulong)*(uint *)(local_258 + 0x4c));
          Bstrlib::CBString::operator+=(&this->securityInfo,(CBString *)local_2c0);
          Bstrlib::CBString::~CBString((CBString *)local_2c0);
          for (local_2c1 = 0; local_2c1 < 0x20; local_2c1 = local_2c1 + 1) {
            usprintf((CBString *)((long)&range_2.Hash.d.field_2 + 8),"%02X",
                     (ulong)(byte)local_258[(ulong)local_2c1 + 0x28]);
            Bstrlib::CBString::operator+=
                      (&this->securityInfo,(CBString *)((long)&range_2.Hash.d.field_2 + 8));
            Bstrlib::CBString::~CBString((CBString *)((long)&range_2.Hash.d.field_2 + 8));
          }
          Bstrlib::CBString::operator+=(&this->securityInfo,"\n");
          if (((*(int *)(local_258 + 0x20) != -1) && (*(int *)(local_258 + 0x24) != 0)) &&
             (*(int *)(local_258 + 0x24) != -1)) {
            local_310._0_4_ = 0;
            local_310._4_4_ = 0;
            range_2.Offset._0_2_ = 0;
            range_2.Offset._2_1_ = 0;
            UByteArray::UByteArray((UByteArray *)&range_2.AlgorithmId);
            local_310._0_4_ = *(undefined4 *)(local_258 + 0x20);
            local_310._4_4_ = *(undefined4 *)(local_258 + 0x24);
            range_2.Offset._0_2_ = 0xb;
            UByteArray::UByteArray((UByteArray *)((long)&range_3.Hash.d.field_2 + 8),local_258,0x20)
            ;
            UByteArray::operator=
                      ((UByteArray *)&range_2.AlgorithmId,
                       (UByteArray *)((long)&range_3.Hash.d.field_2 + 8));
            UByteArray::~UByteArray((UByteArray *)((long)&range_3.Hash.d.field_2 + 8));
            range_2.Offset._2_1_ = 6;
            std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                      (&this->protectedRanges,(value_type *)local_310);
            PROTECTED_RANGE_::~PROTECTED_RANGE_((PROTECTED_RANGE_ *)local_310);
          }
          if (((*(int *)(local_258 + 0x48) != -1) && (*(int *)(local_258 + 0x4c) != 0)) &&
             (*(int *)(local_258 + 0x4c) != -1)) {
            local_360._0_4_ = 0;
            local_360._4_4_ = 0;
            range_3.Offset._0_2_ = 0;
            range_3.Offset._2_1_ = 0;
            UByteArray::UByteArray((UByteArray *)&range_3.AlgorithmId);
            local_360._0_4_ = *(undefined4 *)(local_258 + 0x48);
            local_360._4_4_ = *(undefined4 *)(local_258 + 0x4c);
            range_3.Offset._0_2_ = 0xb;
            UByteArray::UByteArray(&local_380,local_258 + 0x28,0x20);
            UByteArray::operator=((UByteArray *)&range_3.AlgorithmId,&local_380);
            UByteArray::~UByteArray(&local_380);
            range_3.Offset._2_1_ = 6;
            std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                      (&this->protectedRanges,(value_type *)local_360);
            PROTECTED_RANGE_::~PROTECTED_RANGE_((PROTECTED_RANGE_ *)local_360);
          }
          pTVar1 = this->model;
          Bstrlib::CBString::CBString((CBString *)&entry_4,"AMI v2 protected ranges hash file");
          TreeModel::setText(pTVar1,(UModelIndex *)local_190,(CBString *)&entry_4);
          Bstrlib::CBString::~CBString((CBString *)&entry_4);
        }
        else if (local_54 == 0x70) {
          local_3a0 = UByteArray::constData(local_30);
          UVar3 = TreeModel::base(this->model,(UModelIndex *)local_190);
          usprintf(&local_3b8,
                   "AMI v3 protected ranges hash file found at base %08Xh\nProtected ranges:",
                   (ulong)UVar3);
          Bstrlib::CBString::operator+=(&this->securityInfo,&local_3b8);
          Bstrlib::CBString::~CBString(&local_3b8);
          usprintf(&local_3d0,"\nFvBaseSegment 0 Address: %08Xh, Size: %Xh",
                   (ulong)*(uint *)(local_3a0 + 0x20),(ulong)*(uint *)(local_3a0 + 0x2c));
          Bstrlib::CBString::operator+=(&this->securityInfo,&local_3d0);
          Bstrlib::CBString::~CBString(&local_3d0);
          usprintf(&local_3e8,"\nFvBaseSegment 1 Address: %08Xh, Size: %Xh",
                   (ulong)*(uint *)(local_3a0 + 0x24),(ulong)*(uint *)(local_3a0 + 0x30));
          Bstrlib::CBString::operator+=(&this->securityInfo,&local_3e8);
          Bstrlib::CBString::~CBString(&local_3e8);
          usprintf(&local_400,"\nFvBaseSegment 2 Address: %08Xh, Size: %Xh",
                   (ulong)*(uint *)(local_3a0 + 0x28),(ulong)*(uint *)(local_3a0 + 0x34));
          Bstrlib::CBString::operator+=(&this->securityInfo,&local_400);
          Bstrlib::CBString::~CBString(&local_400);
          usprintf(&local_418,"\nNestedFvBase Address: %08Xh, Size: %Xh",
                   (ulong)*(uint *)(local_3a0 + 0x38),(ulong)*(uint *)(local_3a0 + 0x3c));
          Bstrlib::CBString::operator+=(&this->securityInfo,&local_418);
          Bstrlib::CBString::~CBString(&local_418);
          usprintf((CBString *)local_430,"\nHash (SHA256): ");
          Bstrlib::CBString::operator+=(&this->securityInfo,(CBString *)local_430);
          Bstrlib::CBString::~CBString((CBString *)local_430);
          for (local_431 = 0; local_431 < 0x20; local_431 = local_431 + 1) {
            usprintf((CBString *)((long)&range_4.Hash.d.field_2 + 8),"%02X",
                     (ulong)(byte)local_3a0[local_431]);
            Bstrlib::CBString::operator+=
                      (&this->securityInfo,(CBString *)((long)&range_4.Hash.d.field_2 + 8));
            Bstrlib::CBString::~CBString((CBString *)((long)&range_4.Hash.d.field_2 + 8));
          }
          Bstrlib::CBString::operator+=(&this->securityInfo,"\n");
          if (((*(int *)(local_3a0 + 0x20) != -1) && (*(int *)(local_3a0 + 0x2c) != 0)) &&
             (*(int *)(local_3a0 + 0x2c) != -1)) {
            local_480._0_4_ = 0;
            local_480._4_4_ = 0;
            range_4.Offset._0_2_ = 0;
            range_4.Offset._2_1_ = 0;
            UByteArray::UByteArray((UByteArray *)&range_4.AlgorithmId);
            local_480._0_4_ = *(undefined4 *)(local_3a0 + 0x20);
            local_480._4_4_ = *(undefined4 *)(local_3a0 + 0x2c);
            range_4.Offset._0_2_ = 0xb;
            UByteArray::UByteArray((UByteArray *)((long)&range_5.Hash.d.field_2 + 8),local_3a0,0x20)
            ;
            UByteArray::operator=
                      ((UByteArray *)&range_4.AlgorithmId,
                       (UByteArray *)((long)&range_5.Hash.d.field_2 + 8));
            UByteArray::~UByteArray((UByteArray *)((long)&range_5.Hash.d.field_2 + 8));
            range_4.Offset._2_1_ = 7;
            std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                      (&this->protectedRanges,(value_type *)local_480);
            PROTECTED_RANGE_::~PROTECTED_RANGE_((PROTECTED_RANGE_ *)local_480);
          }
          if (((*(int *)(local_3a0 + 0x24) != -1) && (*(int *)(local_3a0 + 0x30) != 0)) &&
             (*(int *)(local_3a0 + 0x30) != -1)) {
            local_4d0._0_4_ = 0;
            local_4d0._4_4_ = 0;
            range_5.Offset._0_2_ = 0;
            range_5.Offset._2_1_ = 0;
            UByteArray::UByteArray((UByteArray *)&range_5.AlgorithmId);
            local_4d0._0_4_ = *(undefined4 *)(local_3a0 + 0x24);
            local_4d0._4_4_ = *(undefined4 *)(local_3a0 + 0x30);
            range_5.Offset._0_2_ = 0xb;
            UByteArray::UByteArray((UByteArray *)((long)&range_6.Hash.d.field_2 + 8),local_3a0,0x20)
            ;
            UByteArray::operator=
                      ((UByteArray *)&range_5.AlgorithmId,
                       (UByteArray *)((long)&range_6.Hash.d.field_2 + 8));
            UByteArray::~UByteArray((UByteArray *)((long)&range_6.Hash.d.field_2 + 8));
            range_5.Offset._2_1_ = 7;
            std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                      (&this->protectedRanges,(value_type *)local_4d0);
            PROTECTED_RANGE_::~PROTECTED_RANGE_((PROTECTED_RANGE_ *)local_4d0);
          }
          if (((*(int *)(local_3a0 + 0x28) != -1) && (*(int *)(local_3a0 + 0x34) != 0)) &&
             (*(int *)(local_3a0 + 0x34) != -1)) {
            local_520._0_4_ = 0;
            local_520._4_4_ = 0;
            range_6.Offset._0_2_ = 0;
            range_6.Offset._2_1_ = 0;
            UByteArray::UByteArray((UByteArray *)&range_6.AlgorithmId);
            local_520._0_4_ = *(undefined4 *)(local_3a0 + 0x28);
            local_520._4_4_ = *(undefined4 *)(local_3a0 + 0x34);
            range_6.Offset._0_2_ = 0xb;
            UByteArray::UByteArray((UByteArray *)((long)&range_7.Hash.d.field_2 + 8),local_3a0,0x20)
            ;
            UByteArray::operator=
                      ((UByteArray *)&range_6.AlgorithmId,
                       (UByteArray *)((long)&range_7.Hash.d.field_2 + 8));
            UByteArray::~UByteArray((UByteArray *)((long)&range_7.Hash.d.field_2 + 8));
            range_6.Offset._2_1_ = 7;
            std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                      (&this->protectedRanges,(value_type *)local_520);
            PROTECTED_RANGE_::~PROTECTED_RANGE_((PROTECTED_RANGE_ *)local_520);
          }
          if (((*(int *)(local_3a0 + 0x38) != -1) && (*(int *)(local_3a0 + 0x3c) != 0)) &&
             (*(int *)(local_3a0 + 0x3c) != -1)) {
            local_570._0_4_ = 0;
            local_570._4_4_ = 0;
            range_7.Offset._0_2_ = 0;
            range_7.Offset._2_1_ = 0;
            UByteArray::UByteArray((UByteArray *)&range_7.AlgorithmId);
            local_570._0_4_ = *(undefined4 *)(local_3a0 + 0x38);
            local_570._4_4_ = *(undefined4 *)(local_3a0 + 0x3c);
            range_7.Offset._0_2_ = 0xb;
            UByteArray::UByteArray(&local_590,local_3a0,0x20);
            UByteArray::operator=((UByteArray *)&range_7.AlgorithmId,&local_590);
            UByteArray::~UByteArray(&local_590);
            range_7.Offset._2_1_ = 7;
            std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                      (&this->protectedRanges,(value_type *)local_570);
            PROTECTED_RANGE_::~PROTECTED_RANGE_((PROTECTED_RANGE_ *)local_570);
          }
          pTVar1 = this->model;
          Bstrlib::CBString::CBString(&local_5a8,"AMI v3 protected ranges hash file");
          TreeModel::setText(pTVar1,(UModelIndex *)local_190,&local_5a8);
          Bstrlib::CBString::~CBString(&local_5a8);
        }
        else {
          usprintf(&local_5c0,"%s: unknown or corrupted AMI protected ranges hash file",
                   "parseVendorHashFile");
          msg(this,&local_5c0,(UModelIndex *)local_190);
          Bstrlib::CBString::~CBString(&local_5c0);
        }
      }
    }
    this_local = (FfsParser *)0x0;
    UByteArray::~UByteArray((UByteArray *)local_50);
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseVendorHashFile(const UByteArray & fileGuid, const UModelIndex & index)
{
    // Check sanity
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    const UByteArray& body = model->body(index);
    UINT32 size = (UINT32)body.size();
    if (fileGuid == PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_PHOENIX) {
        if (size < sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_PHOENIX)) {
            msg(usprintf("%s: unknown or corrupted Phoenix protected ranges hash file", __FUNCTION__), index);
        }
        else {
            const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_PHOENIX* header = (const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_PHOENIX*)body.constData();
            if (header->Signature == BG_VENDOR_HASH_FILE_SIGNATURE_PHOENIX) {
                if (size < sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_PHOENIX) + header->NumEntries * sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY)) {
                    msg(usprintf("%s: unknown or corrupted Phoenix protected ranges hash file", __FUNCTION__), index);
                }
                else {
                    if (header->NumEntries > 0) {
                        bool protectedRangesFound = false;
                        for (UINT32 i = 0; i < header->NumEntries; i++) {
                            const PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY*)(header + 1) + i;
                            if (entry->Base != 0xFFFFFFFF && entry->Size != 0 && entry->Size != 0xFFFFFFFF) {
                                protectedRangesFound = true;
                                PROTECTED_RANGE range = {};
                                range.Offset = entry->Base;
                                range.Size = entry->Size;
                                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                                range.Type = PROTECTED_RANGE_VENDOR_HASH_PHOENIX;
                                protectedRanges.push_back(range);
                            }
                        }

                        if (protectedRangesFound) {
                            securityInfo += usprintf("Phoenix hash file found at base %08Xh\nProtected ranges:\n", model->base(index));
                            for (UINT32 i = 0; i < header->NumEntries; i++) {
                                const PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY*)(header + 1) + i;
                                securityInfo += usprintf("RelativeOffset: %08Xh Size: %Xh\nHash: ", entry->Base, entry->Size);
                                for (UINT8 j = 0; j < sizeof(entry->Hash); j++) {
                                    securityInfo += usprintf("%02X", entry->Hash[j]);
                                }
                                securityInfo += "\n";
                            }
                        }
                    }
                }
            }
        }

        model->setText(index, UString("Phoenix protected ranges hash file"));
    }
    else if (fileGuid == PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_AMI) {
        UModelIndex fileIndex = model->parent(index);
        if (size == sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V1)) {
            securityInfo += usprintf("AMI protected ranges hash file v1 found at base %08Xh\nProtected range:\n", model->base(fileIndex));
            const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V1* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V1*)(body.constData());
            securityInfo += usprintf("Size: %Xh\nHash (SHA256): ", entry->Size);
            for (UINT8 i = 0; i < sizeof(entry->Hash); i++) {
                securityInfo += usprintf("%02X", entry->Hash[i]);
            }
            securityInfo += "\n";

            if (entry->Size != 0 && entry->Size != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = 0;
                range.Size = entry->Size;
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V1;
                protectedRanges.push_back(range);
            }

            model->setText(fileIndex, UString("AMI v1 protected ranges hash file"));
        }
        else if (size == sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V2)) {
            const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V2* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V2*)(body.constData());

            securityInfo += usprintf("AMI v2 protected ranges hash file found at base %08Xh\nProtected ranges:", model->base(fileIndex));
            securityInfo += usprintf("\nAddress: %08Xh, Size: %Xh\nHash (SHA256): ", entry->Hash0.Base, entry->Hash0.Size);
            for (UINT8 j = 0; j < sizeof(entry->Hash0.Hash); j++) {
                securityInfo += usprintf("%02X", entry->Hash0.Hash[j]);
            }
            securityInfo += usprintf("\nAddress: %08Xh, Size: %Xh\nHash (SHA256): ", entry->Hash1.Base, entry->Hash1.Size);
            for (UINT8 j = 0; j < sizeof(entry->Hash1.Hash); j++) {
                securityInfo += usprintf("%02X", entry->Hash1.Hash[j]);
            }
            securityInfo += "\n";

            if (entry->Hash0.Base != 0xFFFFFFFF && entry->Hash0.Size != 0 && entry->Hash0.Size != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->Hash0.Base;
                range.Size = entry->Hash0.Size;
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash0.Hash, sizeof(entry->Hash0.Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V2;
                protectedRanges.push_back(range);
            }

            if (entry->Hash1.Base != 0xFFFFFFFF && entry->Hash1.Size != 0 && entry->Hash1.Size != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->Hash1.Base;
                range.Size = entry->Hash1.Size;
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash1.Hash, sizeof(entry->Hash1.Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V2;
                protectedRanges.push_back(range);
            }

            model->setText(fileIndex, UString("AMI v2 protected ranges hash file"));
        }
        else if (size == sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V3)) {
            const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V3* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V3*)(body.constData());
            securityInfo += usprintf("AMI v3 protected ranges hash file found at base %08Xh\nProtected ranges:", model->base(fileIndex));
            securityInfo += usprintf("\nFvBaseSegment 0 Address: %08Xh, Size: %Xh", entry->FvMainSegmentBase[0], entry->FvMainSegmentSize[0]);
            securityInfo += usprintf("\nFvBaseSegment 1 Address: %08Xh, Size: %Xh", entry->FvMainSegmentBase[1], entry->FvMainSegmentSize[1]);
            securityInfo += usprintf("\nFvBaseSegment 2 Address: %08Xh, Size: %Xh", entry->FvMainSegmentBase[2], entry->FvMainSegmentSize[2]);
            securityInfo += usprintf("\nNestedFvBase Address: %08Xh, Size: %Xh", entry->NestedFvBase, entry->NestedFvSize);
            securityInfo += usprintf("\nHash (SHA256): ");
            for (UINT8 j = 0; j < sizeof(entry->Hash); j++) {
                securityInfo += usprintf("%02X", entry->Hash[j]);
            }
            securityInfo += "\n";

            if (entry->FvMainSegmentBase[0] != 0xFFFFFFFF && entry->FvMainSegmentSize[0] != 0 && entry->FvMainSegmentSize[0] != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->FvMainSegmentBase[0];
                range.Size = entry->FvMainSegmentSize[0];
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V3;
                protectedRanges.push_back(range);
            }

            if (entry->FvMainSegmentBase[1] != 0xFFFFFFFF && entry->FvMainSegmentSize[1] != 0 && entry->FvMainSegmentSize[1] != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->FvMainSegmentBase[1];
                range.Size = entry->FvMainSegmentSize[1];
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V3;
                protectedRanges.push_back(range);
            }

            if (entry->FvMainSegmentBase[2] != 0xFFFFFFFF && entry->FvMainSegmentSize[2] != 0 && entry->FvMainSegmentSize[2] != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->FvMainSegmentBase[2];
                range.Size = entry->FvMainSegmentSize[2];
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V3;
                protectedRanges.push_back(range);
            }

            if (entry->NestedFvBase != 0xFFFFFFFF && entry->NestedFvSize != 0 && entry->NestedFvSize != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->NestedFvBase;
                range.Size = entry->NestedFvSize;
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V3;
                protectedRanges.push_back(range);
            }

            model->setText(fileIndex, UString("AMI v3 protected ranges hash file"));
        }
        else {
            msg(usprintf("%s: unknown or corrupted AMI protected ranges hash file", __FUNCTION__), fileIndex);
        }
    }

    return U_SUCCESS;
}